

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeliefValue.cpp
# Opt level: O0

vector<double,_std::allocator<double>_> *
BeliefValue::GetValues(BeliefSetNonStationary *Beliefs,ValueFunctionPOMDPDiscrete *V)

{
  ulong uVar1;
  size_t sVar2;
  BeliefSet *this;
  size_type sVar3;
  reference pvVar4;
  BeliefSet *in_RDX;
  vector<double,_std::allocator<double>_> *in_RDI;
  Index k;
  vector<double,_std::allocator<double>_> valuesT;
  Index t;
  Index i;
  vector<double,_std::allocator<double>_> *values;
  Index in_stack_ffffffffffffff5c;
  BeliefSetNonStationary *in_stack_ffffffffffffff60;
  allocator_type *in_stack_ffffffffffffff70;
  size_type in_stack_ffffffffffffff78;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff80;
  uint local_54;
  vector<double,_std::allocator<double>_> local_50;
  uint local_34;
  uint local_30;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 uVar5;
  
  uVar5 = 0;
  BeliefSetNonStationary::Size((BeliefSetNonStationary *)in_stack_ffffffffffffff70);
  std::allocator<double>::allocator((allocator<double> *)0x8fef08);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  std::allocator<double>::~allocator((allocator<double> *)0x8fef2b);
  local_30 = 0;
  local_34 = 0;
  while( true ) {
    uVar1 = (ulong)local_34;
    sVar2 = BeliefSetNonStationary::GetNumberOfTimeSteps((BeliefSetNonStationary *)0x8fef51);
    if (uVar1 == sVar2) break;
    this = BeliefSetNonStationary::Get(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
    GetValues(in_RDX,(ValueFunctionPOMDPDiscrete *)CONCAT17(uVar5,in_stack_ffffffffffffffe0));
    for (local_54 = 0; sVar3 = std::vector<double,_std::allocator<double>_>::size(&local_50),
        local_54 != sVar3; local_54 = local_54 + 1) {
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_50,(ulong)local_54);
      in_stack_ffffffffffffff60 = (BeliefSetNonStationary *)*pvVar4;
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,(ulong)local_30);
      *pvVar4 = (value_type)in_stack_ffffffffffffff60;
      local_30 = local_30 + 1;
    }
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)this);
    local_34 = local_34 + 1;
  }
  return in_RDI;
}

Assistant:

vector<double> BeliefValue::GetValues(const BeliefSetNonStationary &Beliefs,
                                      const ValueFunctionPOMDPDiscrete &V)
{
    vector<double> values(Beliefs.Size());
    Index i=0;
    for(Index t=0;t!=Beliefs.GetNumberOfTimeSteps();++t)
    {
        vector<double> valuesT=GetValues(Beliefs.Get(t),V);
        for(Index k=0;k!=valuesT.size();++k)
        {
            values[i]=valuesT[k];
            i++;
        }
    }
    return(values);
}